

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.h
# Opt level: O1

Index __thiscall wasm::analysis::CFGBlockIndexes::get(CFGBlockIndexes *this,Expression *expr)

{
  ulong uVar1;
  Index IVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->map)._M_h._M_bucket_count;
  uVar4 = (ulong)expr % uVar1;
  p_Var5 = (this->map)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Expression *)p_Var5->_M_nxt[1]._M_nxt != expr)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Expression *)p_Var3[1]._M_nxt == expr)) goto LAB_0070c66b;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0070c66b:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    IVar2 = 0xffffffff;
  }
  else {
    IVar2 = *(Index *)&p_Var3[2]._M_nxt;
  }
  return IVar2;
}

Assistant:

Index get(Expression* expr) const {
    auto iter = map.find(expr);
    if (iter == map.end()) {
      // There is no entry for this, which can be the case for control flow
      // structures, or for unreachable code.
      return InvalidBlock;
    }
    return iter->second;
  }